

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  uint i;
  Mio_Cell2_t *pMVar1;
  Gia_Man_t *p_00;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Nf_Mat_t *pNVar6;
  word wVar7;
  word wVar8;
  int *pCutSet;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint c;
  ulong uVar15;
  byte bVar16;
  Nf_Mat_t Mb;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  iVar14 = p->pGia->nObjs;
  while (1 < iVar14) {
    iVar14 = iVar14 + -1;
    pGVar5 = Gia_ManObj(p->pGia,iVar14);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar3 = Gia_ObjIsBuf(pGVar5);
      if (iVar3 == 0) {
        for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
          iVar4 = Nf_ObjMapRefNum(p,iVar14,iVar3);
          if (iVar4 != 0) {
            pNVar6 = Nf_ObjMatchBest(p,iVar14,iVar3);
            iVar4 = Nf_ObjRequired(p,iVar14,iVar3);
            if (iVar4 < pNVar6->D) {
              __assert_fail("pM->D <= Required",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                            ,0x7aa,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
            }
            if ((pNVar6->field_0x3 & 0x40) == 0) {
              wVar7 = Nf_MatchDeref_rec(p,iVar14,iVar3,pNVar6);
              if (-1 < *(int *)pNVar6) {
                __assert_fail("pM->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7b0,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              Nf_ManElaBestMatch(p,iVar14,iVar3,&Mb,iVar4);
              wVar8 = Nf_MatchRef_rec(p,iVar14,iVar3,&Mb,iVar4,(Vec_Int_t *)0x0);
              uVar2 = Mb._0_4_;
              if (-1 < (int)Mb._0_4_) {
                __assert_fail("pMb->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7c1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if (iVar4 < Mb.D) {
                __assert_fail("pMb->D <= Required",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7c2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if (wVar7 < wVar8) {
                __assert_fail("AreaBef >= AreaAft",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7c4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              *(ulong *)pNVar6 = CONCAT44(Mb.Cfg,Mb._0_4_);
              pNVar6->D = Mb.D;
              pNVar6->F = Mb.F;
              uVar13 = Mb._0_4_ & 0xfffff;
              pMVar1 = p->pCells;
              pCutSet = Nf_ObjCutSet(p,iVar14);
              puVar9 = (uint *)Nf_CutFromHandle(pCutSet,(uint)uVar2 >> 0x14 & 0x3ff);
              uVar12 = (uint)Mb.Cfg >> 8;
              uVar10 = (uint)Mb.Cfg >> 1;
              bVar16 = 0;
              uVar15 = 0;
              while ((uVar15 < (*puVar9 & 0x1f) &&
                     (i = puVar9[(ulong)(uVar12 >> (bVar16 & 0x1f) & 0xf) + 1], i != 0))) {
                c = (uint)(((uVar10 & 0x7f) >> ((uint)uVar15 & 0x1f) & 1) != 0);
                pNVar6 = Nf_ObjMatchBest(p,i,c);
                iVar11 = iVar4 - pMVar1[uVar13].iDelays[uVar15];
                if (iVar11 < pNVar6->D) {
                  __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7cc,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                Nf_ObjUpdateRequired(p,i,c,iVar11);
                if ((pNVar6->field_0x3 & 0x40) != 0) {
                  pNVar6 = Nf_ObjMatchBest(p,i,c ^ 1);
                  iVar11 = iVar4 - (pMVar1[uVar13].iDelays[uVar15] + p->InvDelayI);
                  if (iVar11 < pNVar6->D) {
                    __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                  ,0x7d1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                  }
                  Nf_ObjUpdateRequired(p,i,c ^ 1,iVar11);
                }
                uVar15 = uVar15 + 1;
                bVar16 = bVar16 + 4;
              }
            }
          }
        }
      }
      else {
        iVar3 = Nf_ObjMapRefNum(p,iVar14,1);
        if (iVar3 != 0) {
          iVar3 = Nf_ObjRequired(p,iVar14,1);
          Nf_ObjUpdateRequired(p,iVar14,0,iVar3 - p->InvDelayI);
        }
        uVar10 = *(uint *)pGVar5;
        iVar3 = Nf_ObjRequired(p,iVar14,0);
        Nf_ObjUpdateRequired(p,iVar14 - (uVar10 & 0x1fffffff),uVar10 >> 0x1d & 1,iVar3);
      }
    }
  }
  iVar14 = 0;
  while( true ) {
    p_00 = p->pGia;
    if (p_00->vCis->nSize <= iVar14) {
      return;
    }
    pGVar5 = Gia_ManCi(p_00,iVar14);
    iVar3 = Gia_ObjId(p_00,pGVar5);
    if (iVar3 == 0) break;
    iVar4 = Nf_ObjMapRefNum(p,iVar3,1);
    if (iVar4 != 0) {
      iVar4 = Nf_ObjRequired(p,iVar14,1);
      Nf_ObjUpdateRequired(p,iVar3,0,iVar4 - p->InvDelayI);
    }
    iVar14 = iVar14 + 1;
  }
  return;
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}